

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool goodToCopy(Options *options,QString *file,QStringList *unmetDependencies)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  QString *lib;
  QString *relativeFileName;
  long in_FS_OFFSET;
  QLatin1String QVar5;
  QArrayDataPointer<char16_t> local_b8;
  QtDependency local_a0;
  QArrayDataPointer<QtDependency> local_70;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar5.m_data = (char *)0x3;
  QVar5.m_size = (qsizetype)file;
  cVar1 = QString::endsWith(QVar5,0x1392e4);
  bVar2 = true;
  if (cVar1 != '\0') {
    bVar2 = checkArchitecture(options,file);
    if (bVar2) {
      local_58.size = -0x5555555555555556;
      local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_58.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
      getQtLibsFromElf((QStringList *)&local_58,options,file);
      bVar2 = true;
      relativeFileName = local_58.ptr;
      for (lVar4 = local_58.size * 0x18; lVar4 != 0; lVar4 = lVar4 + -0x18) {
        QHash<QString,_QList<QtDependency>_>::value
                  ((QList<QtDependency> *)&local_70,&options->qtDependencies,
                   &options->currentArchitecture);
        absoluteFilePath((QString *)&local_b8,options,relativeFileName);
        QtDependency::QtDependency(&local_a0,relativeFileName,(QString *)&local_b8);
        bVar3 = QListSpecialMethodsBase<QtDependency>::contains<QtDependency>
                          ((QListSpecialMethodsBase<QtDependency> *)&local_70,&local_a0);
        QtDependency::~QtDependency(&local_a0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        QArrayDataPointer<QtDependency>::~QArrayDataPointer(&local_70);
        if (!bVar3) {
          QList<QString>::emplaceBack<QString_const&>(unmetDependencies,relativeFileName);
          bVar2 = false;
        }
        relativeFileName = relativeFileName + 1;
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
    }
    else {
      bVar2 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool goodToCopy(const Options *options, const QString &file, QStringList *unmetDependencies)
{
    if (!file.endsWith(".so"_L1))
        return true;

    if (!checkArchitecture(*options, file))
        return false;

    bool ret = true;
    const auto libs = getQtLibsFromElf(*options, file);
    for (const QString &lib : libs) {
        if (!options->qtDependencies[options->currentArchitecture].contains(QtDependency(lib, absoluteFilePath(options, lib)))) {
            ret = false;
            unmetDependencies->append(lib);
        }
    }

    return ret;
}